

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_console.cpp
# Opt level: O1

void C_NewModeAdjust(void)

{
  int in_ESI;
  
  C_InitConsole((screen->super_DSimpleCanvas).super_DCanvas.Width,in_ESI,true);
  if (NotifyStrings.Text.Count != 0) {
    TArray<FNotifyText,_FNotifyText>::DoDelete(&NotifyStrings.Text,0,NotifyStrings.Text.Count - 1);
    NotifyStrings.Text.Count = 0;
  }
  C_AdjustBottom();
  return;
}

Assistant:

void C_NewModeAdjust ()
{
	C_InitConsole (SCREENWIDTH, SCREENHEIGHT, true);
	C_FlushDisplay ();
	C_AdjustBottom ();
}